

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::roundToMagnitude
          (DecimalQuantity *this,int32_t magnitude,RoundingMode roundingMode,UErrorCode *status)

{
  int8_t *piVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  ulong local_38;
  
  iVar6 = this->scale;
  uVar3 = magnitude - iVar6;
  uVar11 = 0x80000000;
  if ((int)uVar3 <= magnitude) {
    uVar11 = uVar3;
  }
  if (iVar6 < 1) {
    uVar11 = uVar3;
  }
  uVar12 = 0x7fffffff;
  if (magnitude <= (int)uVar3) {
    uVar12 = (ulong)uVar11;
  }
  if (-1 < iVar6) {
    uVar12 = (ulong)uVar11;
  }
  uVar11 = (uint)uVar12;
  if ((int)uVar11 < 1 && this->isApproximate == '\0') {
    return;
  }
  iVar6 = this->precision;
  if ((long)iVar6 == 0) {
    return;
  }
  uVar3 = uVar11 - 1;
  bVar14 = this->usingBytes;
  if (bVar14 == true) {
    if ((int)uVar3 < iVar6 && -1 < (int)uVar3) {
      bVar7 = (this->fBCD).bcdBytes.ptr[uVar3];
    }
    else {
LAB_0020ecf0:
      bVar7 = 0;
    }
  }
  else {
    if (0xf < uVar3) goto LAB_0020ecf0;
    bVar7 = (byte)((this->fBCD).bcdLong >> ((char)uVar3 * '\x04' & 0x3fU)) & 0xf;
  }
  if (bVar14 == false) {
    if (0xf < uVar11) goto LAB_0020ed35;
    local_38 = (this->fBCD).bcdLong >> ((char)uVar12 * '\x04' & 0x3fU) & 0xffffffffffffff0f;
  }
  else if ((int)uVar11 < iVar6 && -1 < (int)uVar11) {
    local_38 = (ulong)(byte)(this->fBCD).bcdBytes.ptr[uVar12];
  }
  else {
LAB_0020ed35:
    local_38 = 0;
  }
  if (this->isApproximate == '\0') {
    iVar10 = 1;
    if (('\x04' < (char)bVar7) && (iVar10 = 3, bVar7 == 5)) {
      uVar12 = 0x80000000;
      if (-0x7fffffff < (int)uVar11) {
        uVar12 = (ulong)(uVar11 - 2);
      }
      if (-1 < (int)uVar12) {
        piVar1 = (this->fBCD).bcdBytes.ptr;
        lVar5 = uVar12 * 4;
        do {
          if (bVar14 == false) {
            if (0xf < uVar12) goto LAB_0020ee13;
            bVar7 = (byte)((ulong)piVar1 >> ((byte)lVar5 & 0x3f)) & 0xf;
          }
          else if ((long)uVar12 < (long)iVar6) {
            bVar7 = piVar1[uVar12];
          }
          else {
LAB_0020ee13:
            bVar7 = 0;
          }
          if (bVar7 != 0) goto LAB_0020ef94;
          lVar5 = lVar5 + -4;
          bVar13 = 0 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar13);
      }
      iVar10 = 2;
    }
  }
  else {
    iVar4 = -0x80000000;
    if (-0x7fffffff < (int)uVar11) {
      iVar4 = uVar11 - 2;
    }
    iVar2 = uprv_max_63(0,iVar6 + -0xe);
    switch(bVar7) {
    case 0:
      iVar10 = -1;
      if (iVar2 <= iVar4) {
        piVar1 = (this->fBCD).bcdBytes.ptr;
        uVar9 = 0x80000002;
        if (-0x7ffffffe < (int)uVar11) {
          uVar9 = uVar11;
        }
        iVar4 = uVar9 * 4 + -8;
        uVar9 = uVar9 - 1;
LAB_0020f102:
        uVar9 = uVar9 - 1;
        if (this->usingBytes == false) {
          if (uVar9 < 0x10) {
            bVar7 = (byte)((ulong)piVar1 >> ((byte)iVar4 & 0x3f)) & 0xf;
          }
          else {
            bVar7 = 0;
          }
        }
        else {
          bVar7 = 0;
          if ((-1 < (int)uVar9) && ((int)uVar9 < this->precision)) {
            bVar7 = piVar1[uVar9];
          }
        }
        iVar6 = 1;
        bVar14 = bVar7 != 0;
        if (!bVar14) goto code_r0x0020f145;
        bVar13 = false;
LAB_0020f269:
        iVar6 = 1;
        iVar10 = 1;
        break;
      }
      iVar6 = 1;
LAB_0020ef05:
      bVar13 = false;
      bVar14 = false;
      break;
    default:
      iVar6 = (uint)('\x04' < (char)bVar7) * 2 + 1;
      bVar14 = true;
      bVar13 = false;
      iVar10 = iVar6;
      break;
    case 4:
      bVar14 = true;
      if (iVar2 <= iVar4) {
        piVar1 = (this->fBCD).bcdBytes.ptr;
        uVar9 = 0x80000002;
        if (-0x7ffffffe < (int)uVar11) {
          uVar9 = uVar11;
        }
        iVar6 = uVar9 * 4 + -8;
        uVar9 = uVar9 - 1;
        do {
          uVar9 = uVar9 - 1;
          if (this->usingBytes == false) {
            if (uVar9 < 0x10) {
              bVar7 = (byte)((ulong)piVar1 >> ((byte)iVar6 & 0x3f)) & 0xf;
            }
            else {
              bVar7 = 0;
            }
          }
          else {
            bVar7 = 0;
            if ((-1 < (int)uVar9) && (bVar7 = 0, (int)uVar9 < this->precision)) {
              bVar7 = piVar1[uVar9];
            }
          }
          bVar13 = bVar7 == 9;
          if (!bVar13) goto LAB_0020f269;
          iVar6 = iVar6 + -4;
        } while (iVar2 < (int)uVar9);
        goto LAB_0020f1cc;
      }
LAB_0020eee6:
      bVar14 = true;
      iVar6 = 2;
      bVar13 = true;
      iVar10 = 2;
      break;
    case 5:
      bVar14 = true;
      if (iVar4 < iVar2) goto LAB_0020eee6;
      piVar1 = (this->fBCD).bcdBytes.ptr;
      uVar9 = 0x80000002;
      if (-0x7ffffffe < (int)uVar11) {
        uVar9 = uVar11;
      }
      iVar6 = uVar9 * 4 + -8;
      uVar9 = uVar9 - 1;
      do {
        uVar9 = uVar9 - 1;
        if (this->usingBytes == false) {
          if (uVar9 < 0x10) {
            bVar7 = (byte)((ulong)piVar1 >> ((byte)iVar6 & 0x3f)) & 0xf;
          }
          else {
            bVar7 = 0;
          }
        }
        else {
          bVar7 = 0;
          if ((-1 < (int)uVar9) && (bVar7 = 0, (int)uVar9 < this->precision)) {
            bVar7 = piVar1[uVar9];
          }
        }
        bVar13 = bVar7 == 0;
        if (!bVar13) goto LAB_0020f276;
        iVar6 = iVar6 + -4;
      } while (iVar2 < (int)uVar9);
LAB_0020f1cc:
      iVar6 = 2;
      bVar14 = true;
      iVar10 = 2;
      break;
    case 9:
      iVar10 = -2;
      if (iVar4 < iVar2) {
        iVar6 = 3;
        goto LAB_0020ef05;
      }
      piVar1 = (this->fBCD).bcdBytes.ptr;
      uVar9 = 0x80000002;
      if (-0x7ffffffe < (int)uVar11) {
        uVar9 = uVar11;
      }
      iVar4 = uVar9 * 4 + -8;
      uVar9 = uVar9 - 1;
      do {
        uVar9 = uVar9 - 1;
        if (this->usingBytes == false) {
          if (uVar9 < 0x10) {
            bVar7 = (byte)((ulong)piVar1 >> ((byte)iVar4 & 0x3f)) & 0xf;
          }
          else {
            bVar7 = 0;
          }
        }
        else {
          bVar7 = 0;
          if ((-1 < (int)uVar9) && ((int)uVar9 < this->precision)) {
            bVar7 = piVar1[uVar9];
          }
        }
        iVar6 = 3;
        bVar14 = bVar7 != 9;
        if (bVar14) {
          bVar13 = false;
          goto LAB_0020f276;
        }
        iVar4 = iVar4 + -4;
      } while (iVar2 < (int)uVar9);
LAB_0020f252:
      bVar13 = false;
    }
LAB_0020ef2d:
    if (((!(bool)(bVar14 | UNUM_ROUND_UP < roundingMode)) ||
        ((bool)(UNUM_ROUND_UP < roundingMode & bVar13))) || ((int)uVar3 < this->precision + -0xe)) {
      convertToAccurateDouble(this);
      roundToMagnitude(this,magnitude,roundingMode,status);
      bVar14 = false;
    }
    else {
      bVar14 = 0 < (int)uVar11;
      this->isApproximate = '\0';
      this->origDouble = 0.0;
      this->origDelta = 0;
      if (0 < (int)uVar11) {
        iVar10 = iVar6;
      }
    }
    if (!bVar14) {
      return;
    }
  }
LAB_0020ef94:
  if (UNUM_ROUND_HALFUP < roundingMode) goto LAB_0020f00b;
  switch(roundingMode) {
  case UNUM_ROUND_CEILING:
    bVar8 = this->flags & 1;
    break;
  case UNUM_ROUND_FLOOR:
    bVar8 = (this->flags & 1U) == 0;
    break;
  case UNUM_ROUND_UP:
    goto switchD_0020efaf_caseD_3;
  case UNUM_FOUND_HALFEVEN:
    bVar8 = (local_38 & 1) == 0;
    if (iVar10 == 3) goto switchD_0020efaf_caseD_3;
    if (iVar10 == 2) break;
    if (iVar10 != 1) goto LAB_0020f00b;
  case UNUM_ROUND_DOWN:
    bVar8 = 1;
    break;
  case UNUM_ROUND_HALFDOWN:
    if (iVar10 - 1U < 3) {
      bVar7 = (byte)(iVar10 - 1U);
      bVar8 = 3;
LAB_0020f003:
      bVar8 = bVar8 >> (bVar7 & 7);
      break;
    }
    goto LAB_0020f00b;
  case UNUM_ROUND_HALFUP:
    if (iVar10 - 1U < 3) {
      bVar7 = (byte)(iVar10 - 1U);
      bVar8 = 1;
      goto LAB_0020f003;
    }
LAB_0020f00b:
    *status = U_FORMAT_INEXACT_ERROR;
switchD_0020efaf_caseD_3:
    bVar8 = 0;
  }
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if ((int)uVar11 < this->precision) {
    shiftRight(this,uVar11);
  }
  else {
    setBcdToZero(this);
    this->scale = magnitude;
  }
  if ((bVar8 & 1) == 0) {
    if ((char)local_38 == '\t') {
      piVar1 = (this->fBCD).bcdBytes.ptr;
      bVar7 = 0;
      uVar12 = 0;
      do {
        if (this->usingBytes == false) {
          if (0xf < uVar12) goto LAB_0020f07f;
          bVar8 = (byte)((ulong)piVar1 >> (bVar7 & 0x3f)) & 0xf;
        }
        else if ((long)uVar12 < (long)this->precision) {
          bVar8 = piVar1[uVar12];
        }
        else {
LAB_0020f07f:
          bVar8 = 0;
        }
        uVar12 = uVar12 + 1;
        bVar7 = bVar7 + 4;
      } while (bVar8 == 9);
      shiftRight(this,(int)uVar12 + -1);
    }
    if (this->usingBytes == true) {
      if (this->precision < 1) {
        bVar7 = 0;
      }
      else {
        bVar7 = *(this->fBCD).bcdBytes.ptr;
      }
    }
    else {
      bVar7 = *(byte *)&this->fBCD & 0xf;
    }
    if (this->usingBytes == false) {
      (this->fBCD).bcdLong = (long)(char)(bVar7 + 1) | (this->fBCD).bcdLong & 0xfffffffffffffff0;
    }
    else {
      ensureCapacity(this,1);
      *(this->fBCD).bcdBytes.ptr = bVar7 + 1;
    }
    this->precision = this->precision + 1;
  }
  compact(this);
  return;
LAB_0020f276:
  iVar6 = 3;
  iVar10 = 3;
  goto LAB_0020ef2d;
code_r0x0020f145:
  iVar4 = iVar4 + -4;
  if ((int)uVar9 <= iVar2) goto LAB_0020f252;
  goto LAB_0020f102;
}

Assistant:

void DecimalQuantity::roundToMagnitude(int32_t magnitude, RoundingMode roundingMode, UErrorCode& status) {
    // The position in the BCD at which rounding will be performed; digits to the right of position
    // will be rounded away.
    // TODO: Andy: There was a test failure because of integer overflow here. Should I do
    // "safe subtraction" everywhere in the code?  What's the nicest way to do it?
    int position = safeSubtract(magnitude, scale);

    if (position <= 0 && !isApproximate) {
        // All digits are to the left of the rounding magnitude.
    } else if (precision == 0) {
        // No rounding for zero.
    } else {
        // Perform rounding logic.
        // "leading" = most significant digit to the right of rounding
        // "trailing" = least significant digit to the left of rounding
        int8_t leadingDigit = getDigitPos(safeSubtract(position, 1));
        int8_t trailingDigit = getDigitPos(position);

        // Compute which section of the number we are in.
        // EDGE means we are at the bottom or top edge, like 1.000 or 1.999 (used by doubles)
        // LOWER means we are between the bottom edge and the midpoint, like 1.391
        // MIDPOINT means we are exactly in the middle, like 1.500
        // UPPER means we are between the midpoint and the top edge, like 1.916
        roundingutils::Section section = roundingutils::SECTION_MIDPOINT;
        if (!isApproximate) {
            if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else if (leadingDigit > 5) {
                section = roundingutils::SECTION_UPPER;
            } else {
                for (int p = safeSubtract(position, 2); p >= 0; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            }
        } else {
            int32_t p = safeSubtract(position, 2);
            int32_t minP = uprv_max(0, precision - 14);
            if (leadingDigit == 0) {
                section = roundingutils::SECTION_LOWER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 4) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 5) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit == 9) {
                section = roundingutils::SECTION_UPPER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else {
                section = roundingutils::SECTION_UPPER;
            }

            bool roundsAtMidpoint = roundingutils::roundsAtMidpoint(roundingMode);
            if (safeSubtract(position, 1) < precision - 14 ||
                (roundsAtMidpoint && section == roundingutils::SECTION_MIDPOINT) ||
                (!roundsAtMidpoint && section < 0 /* i.e. at upper or lower edge */)) {
                // Oops! This means that we have to get the exact representation of the double, because
                // the zone of uncertainty is along the rounding boundary.
                convertToAccurateDouble();
                roundToMagnitude(magnitude, roundingMode, status); // start over
                return;
            }

            // Turn off the approximate double flag, since the value is now confirmed to be exact.
            isApproximate = false;
            origDouble = 0.0;
            origDelta = 0;

            if (position <= 0) {
                // All digits are to the left of the rounding magnitude.
                return;
            }

            // Good to continue rounding.
            if (section == -1) { section = roundingutils::SECTION_LOWER; }
            if (section == -2) { section = roundingutils::SECTION_UPPER; }
        }

        bool roundDown = roundingutils::getRoundingDirection((trailingDigit % 2) == 0,
                isNegative(),
                section,
                roundingMode,
                status);
        if (U_FAILURE(status)) {
            return;
        }

        // Perform truncation
        if (position >= precision) {
            setBcdToZero();
            scale = magnitude;
        } else {
            shiftRight(position);
        }

        // Bubble the result to the higher digits
        if (!roundDown) {
            if (trailingDigit == 9) {
                int bubblePos = 0;
                // Note: in the long implementation, the most digits BCD can have at this point is 15,
                // so bubblePos <= 15 and getDigitPos(bubblePos) is safe.
                for (; getDigitPos(bubblePos) == 9; bubblePos++) {}
                shiftRight(bubblePos); // shift off the trailing 9s
            }
            int8_t digit0 = getDigitPos(0);
            U_ASSERT(digit0 != 9);
            setDigitPos(0, static_cast<int8_t>(digit0 + 1));
            precision += 1; // in case an extra digit got added
        }

        compact();
    }
}